

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

Abc_Obj_t * Abc_AigAndCreate(Abc_Aig_t *pMan,Abc_Obj_t *p0,Abc_Obj_t *p1)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int iVar7;
  uint Key;
  Abc_Obj_t *pAnd;
  Abc_Obj_t *p1_local;
  Abc_Obj_t *p0_local;
  Abc_Aig_t *pMan_local;
  
  iVar1 = pMan->nEntries;
  iVar7 = pMan->nBins * 2;
  if (iVar1 != iVar7 && SBORROW4(iVar1,iVar7) == iVar1 + pMan->nBins * -2 < 0) {
    Abc_AigResize(pMan);
  }
  pAVar5 = Abc_ObjRegular(p0);
  iVar1 = pAVar5->Id;
  pAVar5 = Abc_ObjRegular(p1);
  pAnd = p1;
  p1_local = p0;
  if (pAVar5->Id < iVar1) {
    pAnd = p0;
    p1_local = p1;
  }
  pAVar5 = Abc_NtkCreateNode(pMan->pNtkAig);
  Abc_ObjAddFanin(pAVar5,p1_local);
  Abc_ObjAddFanin(pAVar5,pAnd);
  pAVar6 = Abc_ObjRegular(p1_local);
  uVar2 = *(uint *)&pAVar6->field_0x14;
  pAVar6 = Abc_ObjRegular(pAnd);
  iVar1 = Abc_MaxInt(uVar2 >> 0xc,*(uint *)&pAVar6->field_0x14 >> 0xc);
  *(uint *)&pAVar5->field_0x14 = *(uint *)&pAVar5->field_0x14 & 0xfff | (iVar1 + 1) * 0x1000;
  uVar2 = Abc_NodeIsExorType(pAVar5);
  *(uint *)&pAVar5->field_0x14 = *(uint *)&pAVar5->field_0x14 & 0xfffffeff | (uVar2 & 1) << 8;
  uVar3 = Abc_ObjIsComplement(p1_local);
  pAVar6 = Abc_ObjRegular(p1_local);
  uVar2 = *(uint *)&pAVar6->field_0x14;
  uVar4 = Abc_ObjIsComplement(pAnd);
  pAVar6 = Abc_ObjRegular(pAnd);
  *(uint *)&pAVar5->field_0x14 =
       *(uint *)&pAVar5->field_0x14 & 0xffffff7f |
       ((uVar3 ^ uVar2 >> 7 & 1) & (uVar4 ^ *(uint *)&pAVar6->field_0x14 >> 7 & 1) & 1) << 7;
  uVar2 = Abc_HashKey2(p1_local,pAnd,pMan->nBins);
  pAVar5->pNext = pMan->pBins[uVar2];
  pMan->pBins[uVar2] = pAVar5;
  pMan->nEntries = pMan->nEntries + 1;
  (pAVar5->field_6).pTemp = (void *)0x0;
  if (pMan->vAddedCells != (Vec_Ptr_t *)0x0) {
    Vec_PtrPush(pMan->vAddedCells,pAVar5);
  }
  return pAVar5;
}

Assistant:

Abc_Obj_t * Abc_AigAndCreate( Abc_Aig_t * pMan, Abc_Obj_t * p0, Abc_Obj_t * p1 )
{
    Abc_Obj_t * pAnd;
    unsigned Key;
    // check if it is a good time for table resizing
    if ( pMan->nEntries > 2 * pMan->nBins )
        Abc_AigResize( pMan );
    // order the arguments
    if ( Abc_ObjRegular(p0)->Id > Abc_ObjRegular(p1)->Id )
        pAnd = p0, p0 = p1, p1 = pAnd;
    // create the new node
    pAnd = Abc_NtkCreateNode( pMan->pNtkAig );
    Abc_ObjAddFanin( pAnd, p0 );
    Abc_ObjAddFanin( pAnd, p1 );
    // set the level of the new node
    pAnd->Level  = 1 + Abc_MaxInt( Abc_ObjRegular(p0)->Level, Abc_ObjRegular(p1)->Level ); 
    pAnd->fExor  = Abc_NodeIsExorType(pAnd);
    pAnd->fPhase = (Abc_ObjIsComplement(p0) ^ Abc_ObjRegular(p0)->fPhase) & (Abc_ObjIsComplement(p1) ^ Abc_ObjRegular(p1)->fPhase);
    // add the node to the corresponding linked list in the table
    Key = Abc_HashKey2( p0, p1, pMan->nBins );
    pAnd->pNext      = pMan->pBins[Key];
    pMan->pBins[Key] = pAnd;
    pMan->nEntries++;
    // create the cuts if defined
//    if ( pAnd->pNtk->pManCut )
//        Abc_NodeGetCuts( pAnd->pNtk->pManCut, pAnd );
    pAnd->pCopy = NULL;
    // add the node to the list of updated nodes
    if ( pMan->vAddedCells )
        Vec_PtrPush( pMan->vAddedCells, pAnd );
    return pAnd;
}